

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_endpoint_refiner.cpp
# Opt level: O0

bool __thiscall
crnlib::dxt_endpoint_refiner::refine(dxt_endpoint_refiner *this,params *p,results *r)

{
  byte bVar1;
  undefined2 *in_RDX;
  double in_RSI;
  vec<3U,_double> *in_RDI;
  float fVar2;
  vec3F h;
  vec3F l;
  vec3F *in_stack_00000068;
  dxt_endpoint_refiner *in_stack_00000070;
  double factor;
  vec<3U,_double> b;
  vec<3U,_double> a;
  vec<3U,_double> x;
  double beta;
  double alpha;
  double k;
  uint8 c;
  uint i;
  vec<3U,_double> first_color;
  vec<3U,_double> betax_sum;
  vec<3U,_double> alphax_sum;
  double alphabeta_sum;
  double beta2_sum;
  double alpha2_sum;
  vec3F *in_stack_00000310;
  vec3F *in_stack_00000318;
  dxt_endpoint_refiner *in_stack_00000320;
  undefined4 in_stack_fffffffffffffd88;
  float in_stack_fffffffffffffd8c;
  vec<3U,_double> *in_stack_fffffffffffffd90;
  vec<3U,_float> *in_stack_fffffffffffffd98;
  vec<3U,_double> *in_stack_fffffffffffffda8;
  vec<3U,_float> local_24c;
  vec<3U,_float> local_240;
  vec<3U,_float> local_234;
  vec<3U,_float> local_228;
  vec<3U,_float> local_21c [7];
  vec<3U,_double> local_1c8 [4];
  vec<3U,_double> local_168;
  double local_150;
  vec<3U,_double> local_148;
  vec<3U,_double> local_130;
  vec<3U,_double> local_118;
  vec<3U,_double> local_100;
  vec<3U,_double> local_e8;
  vec<3U,_double> local_d0;
  vec<3U,_double> local_b8;
  double local_a0;
  double local_98;
  double local_90;
  byte local_85;
  uint local_84;
  vec<3U,_double> local_80;
  vec<3U,_double> local_68;
  vec<3U,_double> local_50;
  double local_38;
  double local_30;
  double local_28;
  undefined2 *local_20;
  double local_18;
  bool local_1;
  
  if (*(int *)((long)in_RSI + 0x10) == 0) {
    local_1 = false;
  }
  else {
    in_RDI->m_s[0] = in_RSI;
    in_RDI->m_s[1] = (double)in_RDX;
    *(undefined8 *)(in_RDX + 4) = 0xffffffffffffffff;
    *in_RDX = 0;
    in_RDX[1] = 0;
    local_28 = 0.0;
    local_30 = 0.0;
    local_38 = 0.0;
    local_20 = in_RDX;
    local_18 = in_RSI;
    vec<3U,_double>::vec
              (in_stack_fffffffffffffd90,
               (double)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    vec<3U,_double>::vec
              (in_stack_fffffffffffffd90,
               (double)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    vec<3U,_double>::vec
              (in_stack_fffffffffffffd90,
               (double)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    for (local_84 = 0; local_84 < *(uint *)((long)local_18 + 0x10); local_84 = local_84 + 1) {
      local_85 = *(byte *)(*(long *)((long)local_18 + 0x18) + (ulong)local_84);
      if ((*(byte *)((long)local_18 + 0x30) & 1) == 0) {
        fVar2 = ((float)*(byte *)((long)&g_dxt5_to_linear + (ulong)local_85) * 1.0) / 7.0;
      }
      else {
        fVar2 = ((float)*(byte *)((long)&g_dxt1_to_linear + (ulong)local_85) * 1.0) / 3.0;
      }
      local_90 = (double)fVar2;
      local_98 = 1.0 - local_90;
      local_a0 = local_90;
      vec<3U,_double>::vec(&local_b8);
      if ((*(byte *)((long)local_18 + 0x30) & 1) == 0) {
        bVar1 = color_quad<unsigned_char,_int>::operator[]
                          ((color_quad<unsigned_char,_int> *)
                           (*(long *)((long)local_18 + 8) + (ulong)local_84 * 4),
                           *(uint *)((long)local_18 + 0x20));
        vec<3U,_double>::set(&local_b8,(double)((float)bVar1 / 255.0));
      }
      else {
        bVar1 = color_quad<unsigned_char,_int>::operator[]
                          ((color_quad<unsigned_char,_int> *)
                           (*(long *)((long)local_18 + 8) + (ulong)local_84 * 4),0);
        in_stack_fffffffffffffd90 = (vec<3U,_double> *)(double)(((float)bVar1 * 1.0) / 255.0);
        bVar1 = color_quad<unsigned_char,_int>::operator[]
                          ((color_quad<unsigned_char,_int> *)
                           (*(long *)((long)local_18 + 8) + (ulong)local_84 * 4),1);
        in_stack_fffffffffffffd98 = (vec<3U,_float> *)(double)(((float)bVar1 * 1.0) / 255.0);
        bVar1 = color_quad<unsigned_char,_int>::operator[]
                          ((color_quad<unsigned_char,_int> *)
                           (*(long *)((long)local_18 + 8) + (ulong)local_84 * 4),2);
        vec<3U,_double>::set
                  (&local_b8,(double)in_stack_fffffffffffffd90,(double)in_stack_fffffffffffffd98,
                   (double)(((float)bVar1 * 1.0) / 255.0));
      }
      if (local_84 == 0) {
        vec<3U,_double>::operator=(&local_80,&local_b8);
      }
      local_28 = local_98 * local_98 + local_28;
      local_30 = local_a0 * local_a0 + local_30;
      local_38 = local_98 * local_a0 + local_38;
      crnlib::operator*((double)in_stack_fffffffffffffda8,in_RDI);
      vec<3U,_double>::operator+=(&local_50,&local_d0);
      crnlib::operator*((double)in_stack_fffffffffffffda8,in_RDI);
      vec<3U,_double>::operator+=(&local_68,&local_e8);
    }
    vec<3U,_double>::vec(&local_100);
    vec<3U,_double>::vec(&local_118);
    if ((local_30 != 0.0) || (NAN(local_30))) {
      if ((local_28 != 0.0) || (NAN(local_28))) {
        local_150 = local_28 * local_30 - local_38 * local_38;
        if ((local_150 != 0.0) || (NAN(local_150))) {
          crnlib::operator*(in_stack_fffffffffffffda8,(double)in_RDI);
          crnlib::operator*(in_stack_fffffffffffffda8,(double)in_RDI);
          crnlib::operator-(in_stack_fffffffffffffda8,in_RDI);
          operator/(in_stack_fffffffffffffda8,(double)in_RDI);
          vec<3U,_double>::operator=(&local_100,&local_168);
          crnlib::operator*(in_stack_fffffffffffffda8,(double)in_RDI);
          crnlib::operator*(in_stack_fffffffffffffda8,(double)in_RDI);
          crnlib::operator-(in_stack_fffffffffffffda8,in_RDI);
          operator/(in_stack_fffffffffffffda8,(double)in_RDI);
          vec<3U,_double>::operator=(&local_118,local_1c8);
        }
        else {
          vec<3U,_double>::operator=(&local_100,&local_80);
          vec<3U,_double>::operator=(&local_118,&local_80);
        }
      }
      else {
        vec<3U,_double>::clear(&local_100);
        operator/(in_stack_fffffffffffffda8,(double)in_RDI);
        vec<3U,_double>::operator=(&local_118,&local_148);
      }
    }
    else {
      operator/(in_stack_fffffffffffffda8,(double)in_RDI);
      vec<3U,_double>::operator=(&local_100,&local_130);
      vec<3U,_double>::clear(&local_118);
    }
    vec<3U,_float>::vec((vec<3U,_float> *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c);
    vec<3U,_float>::vec((vec<3U,_float> *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c);
    vec<3u,float>::operator=(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    vec<3u,float>::operator=(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    vec<3U,_float>::clamp
              ((vec<3U,_float> *)in_RDI,(float)((ulong)in_stack_fffffffffffffd98 >> 0x20),
               SUB84(in_stack_fffffffffffffd98,0));
    vec<3U,_float>::clamp
              ((vec<3U,_float> *)in_RDI,(float)((ulong)in_stack_fffffffffffffd98 >> 0x20),
               SUB84(in_stack_fffffffffffffd98,0));
    if ((*(byte *)((long)local_18 + 0x30) & 1) == 0) {
      vec<3U,_float>::vec(&local_24c,local_21c);
      vec<3U,_float>::vec((vec<3U,_float> *)&stack0xfffffffffffffda8,&local_228);
      optimize_dxt5(in_stack_00000320,in_stack_00000318,in_stack_00000310);
    }
    else {
      vec<3U,_float>::vec(&local_234,local_21c);
      vec<3U,_float>::vec(&local_240,&local_228);
      optimize_dxt1(in_stack_00000070,in_stack_00000068,(vec3F *)l.m_s._4_8_);
    }
    local_1 = *(ulong *)(local_20 + 4) < *(ulong *)((long)local_18 + 0x28);
  }
  return local_1;
}

Assistant:

bool dxt_endpoint_refiner::refine(const params& p, results& r) {
  if (!p.m_num_pixels)
    return false;

  m_pParams = &p;
  m_pResults = &r;

  r.m_error = cUINT64_MAX;
  r.m_low_color = 0;
  r.m_high_color = 0;

  double alpha2_sum = 0.0f;
  double beta2_sum = 0.0f;
  double alphabeta_sum = 0.0f;

  vec<3, double> alphax_sum(0.0f);
  vec<3, double> betax_sum(0.0f);

  vec<3, double> first_color(0.0f);

  // This linear solver is from Squish.
  for (uint i = 0; i < p.m_num_pixels; ++i) {
    uint8 c = p.m_pSelectors[i];

    double k;
    if (p.m_dxt1_selectors)
      k = g_dxt1_to_linear[c] * 1.0f / 3.0f;
    else
      k = g_dxt5_to_linear[c] * 1.0f / 7.0f;

    double alpha = 1.0f - k;
    double beta = k;

    vec<3, double> x;

    if (p.m_dxt1_selectors)
      x.set(p.m_pPixels[i][0] * 1.0f / 255.0f, p.m_pPixels[i][1] * 1.0f / 255.0f, p.m_pPixels[i][2] * 1.0f / 255.0f);
    else
      x.set(p.m_pPixels[i][p.m_alpha_comp_index] / 255.0f);

    if (!i)
      first_color = x;

    alpha2_sum += alpha * alpha;
    beta2_sum += beta * beta;
    alphabeta_sum += alpha * beta;
    alphax_sum += alpha * x;
    betax_sum += beta * x;
  }

  // zero where non-determinate
  vec<3, double> a, b;
  if (beta2_sum == 0.0f) {
    a = alphax_sum / alpha2_sum;
    b.clear();
  } else if (alpha2_sum == 0.0f) {
    a.clear();
    b = betax_sum / beta2_sum;
  } else {
    double factor = alpha2_sum * beta2_sum - alphabeta_sum * alphabeta_sum;
    if (factor != 0.0f) {
      a = (alphax_sum * beta2_sum - betax_sum * alphabeta_sum) / factor;
      b = (betax_sum * alpha2_sum - alphax_sum * alphabeta_sum) / factor;
    } else {
      a = first_color;
      b = first_color;
    }
  }

  vec3F l(0.0f), h(0.0f);
  l = a;
  h = b;

  l.clamp(0.0f, 1.0f);
  h.clamp(0.0f, 1.0f);

  if (p.m_dxt1_selectors)
    optimize_dxt1(l, h);
  else
    optimize_dxt5(l, h);

  return r.m_error < p.m_error_to_beat;
}